

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

void __thiscall
cfd::core::SchnorrSignature::SetSigHashType(SchnorrSignature *this,SigHashType *sighash_type)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this_00;
  allocator local_39;
  string local_38;
  SigHashType *local_18;
  SigHashType *sighash_type_local;
  SchnorrSignature *this_local;
  
  local_18 = sighash_type;
  sighash_type_local = (SigHashType *)this;
  uVar2 = SigHashType::GetSigHashFlag(sighash_type);
  bVar1 = IsValidSigHashType((uint8_t)uVar2);
  if (!bVar1) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_38,"Invalid sighash type for schnorr signature.",&local_39);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_38);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  SigHashType::operator=(&this->sighash_type_,local_18);
  return;
}

Assistant:

void SchnorrSignature::SetSigHashType(const SigHashType &sighash_type) {
  if (!IsValidSigHashType(
          static_cast<uint8_t>(sighash_type.GetSigHashFlag()))) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid sighash type for schnorr signature.");
  }
  sighash_type_ = sighash_type;
}